

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ccp_pass.cpp
# Opt level: O0

void __thiscall spvtools::opt::CCPPass::Initialize(CCPPass *this)

{
  bool bVar1;
  uint32_t uVar2;
  IRContext *pIVar3;
  ConstantManager *pCVar4;
  mapped_type *pmVar5;
  Module *this_00;
  uint32_t local_48;
  uint32_t local_44;
  Instruction *local_40;
  Instruction *inst;
  iterator __end2;
  iterator __begin2;
  IteratorRange<spvtools::opt::InstructionList::iterator> *__range2;
  CCPPass *this_local;
  
  pIVar3 = Pass::context((Pass *)this);
  pCVar4 = IRContext::get_constant_mgr(pIVar3);
  this->const_mgr_ = pCVar4;
  Pass::get_module((Pass *)this);
  Module::types_values((Module *)&__begin2);
  IteratorRange<spvtools::opt::InstructionList::iterator>::begin
            ((IteratorRange<spvtools::opt::InstructionList::iterator> *)&__end2);
  IteratorRange<spvtools::opt::InstructionList::iterator>::end
            ((IteratorRange<spvtools::opt::InstructionList::iterator> *)&inst);
  while( true ) {
    bVar1 = utils::operator!=(&__end2.super_iterator,
                              (iterator_template<spvtools::opt::Instruction> *)&inst);
    if (!bVar1) break;
    local_40 = utils::IntrusiveList<spvtools::opt::Instruction>::
               iterator_template<spvtools::opt::Instruction>::operator*(&__end2.super_iterator);
    bVar1 = Instruction::IsConstant(local_40);
    if (bVar1) {
      uVar2 = Instruction::result_id(local_40);
      local_44 = Instruction::result_id(local_40);
      pmVar5 = std::
               unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
               ::operator[](&this->values_,&local_44);
      *pmVar5 = uVar2;
    }
    else {
      local_48 = Instruction::result_id(local_40);
      pmVar5 = std::
               unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
               ::operator[](&this->values_,&local_48);
      *pmVar5 = 0xffffffff;
    }
    InstructionList::iterator::operator++(&__end2);
  }
  pIVar3 = Pass::context((Pass *)this);
  this_00 = IRContext::module(pIVar3);
  uVar2 = Module::IdBound(this_00);
  this->original_id_bound_ = uVar2;
  return;
}

Assistant:

void CCPPass::Initialize() {
  const_mgr_ = context()->get_constant_mgr();

  // Populate the constant table with values from constant declarations in the
  // module.  The values of each OpConstant declaration is the identity
  // assignment (i.e., each constant is its own value).
  for (const auto& inst : get_module()->types_values()) {
    // Record compile time constant ids. Treat all other global values as
    // varying.
    if (inst.IsConstant()) {
      values_[inst.result_id()] = inst.result_id();
    } else {
      values_[inst.result_id()] = kVaryingSSAId;
    }
  }

  original_id_bound_ = context()->module()->IdBound();
}